

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void tcg_opt_gen_mov(TCGContext_conflict9 *s,TCGOp *op,TCGArg dst,TCGArg src)

{
  _Bool _Var1;
  TCGTemp *ts1;
  TCGTemp *ts2;
  tcg_temp_info *ptVar2;
  tcg_temp_info *ptVar3;
  tcg_temp_info *ptVar4;
  tcg_temp_info *ni;
  ulong uStack_58;
  TCGOpcode new_op;
  tcg_target_ulong mask;
  tcg_temp_info *si;
  tcg_temp_info *di;
  TCGOpDef *def;
  TCGTemp *src_ts;
  TCGTemp *dst_ts;
  TCGArg src_local;
  TCGArg dst_local;
  TCGOp *op_local;
  TCGContext_conflict9 *s_local;
  
  ts1 = arg_temp(dst);
  ts2 = arg_temp(src);
  _Var1 = ts_are_copies(ts1,ts2);
  if (_Var1) {
    tcg_op_remove_tricore(s,op);
  }
  else {
    reset_ts(ts1);
    ptVar2 = ts_info(ts1);
    ptVar3 = ts_info(ts2);
    if ((s->tcg_op_defs[*(uint *)op & 0xff].flags & 0x40) == 0) {
      if ((s->tcg_op_defs[*(uint *)op & 0xff].flags & 0x10) == 0) {
        ni._4_4_ = 5;
      }
      else {
        ni._4_4_ = 0x3f;
      }
    }
    else {
      ni._4_4_ = 0x89;
    }
    *(uint *)op = *(uint *)op & 0xffffff00 | ni._4_4_;
    op->args[0] = dst;
    op->args[1] = src;
    uStack_58 = ptVar3->mask;
    if (ni._4_4_ == 5) {
      uStack_58 = uStack_58 | 0xffffffff00000000;
    }
    ptVar2->mask = uStack_58;
    if (((uint)((ulong)*(undefined8 *)ts2 >> 0x18) & 0xff) ==
        ((uint)((ulong)*(undefined8 *)ts1 >> 0x18) & 0xff)) {
      ptVar4 = ts_info(ptVar3->next_copy);
      ptVar2->next_copy = ptVar3->next_copy;
      ptVar2->prev_copy = ts2;
      ptVar4->prev_copy = ts1;
      ptVar3->next_copy = ts1;
      ptVar2->is_const = (_Bool)(ptVar3->is_const & 1);
      ptVar2->val = ptVar3->val;
    }
  }
  return;
}

Assistant:

static void tcg_opt_gen_mov(TCGContext *s, TCGOp *op, TCGArg dst, TCGArg src)
{
    TCGTemp *dst_ts = arg_temp(dst);
    TCGTemp *src_ts = arg_temp(src);
    const TCGOpDef *def;
    struct tcg_temp_info *di;
    struct tcg_temp_info *si;
    tcg_target_ulong mask;
    TCGOpcode new_op;

    if (ts_are_copies(dst_ts, src_ts)) {
        tcg_op_remove(s, op);
        return;
    }

    reset_ts(dst_ts);
    di = ts_info(dst_ts);
    si = ts_info(src_ts);
    def = &s->tcg_op_defs[op->opc];
    if (def->flags & TCG_OPF_VECTOR) {
        new_op = INDEX_op_mov_vec;
    } else if (def->flags & TCG_OPF_64BIT) {
        new_op = INDEX_op_mov_i64;
    } else {
        new_op = INDEX_op_mov_i32;
    }
    op->opc = new_op;
    /* TCGOP_VECL and TCGOP_VECE remain unchanged.  */
    op->args[0] = dst;
    op->args[1] = src;

    mask = si->mask;
    if (TCG_TARGET_REG_BITS > 32 && new_op == INDEX_op_mov_i32) {
        /* High bits of the destination are now garbage.  */
        mask |= ~0xffffffffull;
    }
    di->mask = mask;

    if (src_ts->type == dst_ts->type) {
        struct tcg_temp_info *ni = ts_info(si->next_copy);

        di->next_copy = si->next_copy;
        di->prev_copy = src_ts;
        ni->prev_copy = dst_ts;
        si->next_copy = dst_ts;
        di->is_const = si->is_const;
        di->val = si->val;
    }
}